

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_11.cpp
# Opt level: O1

VectorData *
find_max_min_mean<signed_char>
          (VectorData *__return_storage_ptr__,
          vector<signed_char,_std::allocator<signed_char>_> *numbers)

{
  char *pcVar1;
  char *pcVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  
  pcVar1 = (numbers->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar6 = (double)(int)*pcVar1;
  __return_storage_ptr__->max = dVar6;
  __return_storage_ptr__->min = dVar6;
  pcVar2 = (numbers->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar5 = (long)pcVar2 - (long)pcVar1;
  if (lVar5 != 1) {
    dVar3 = __return_storage_ptr__->max;
    dVar7 = __return_storage_ptr__->min;
    while (dVar4 = dVar7, pcVar1 = pcVar1 + 1, pcVar1 != pcVar2) {
      dVar7 = (double)(int)*pcVar1;
      dVar9 = dVar7;
      if (dVar7 <= dVar3) {
        dVar9 = dVar3;
      }
      dVar6 = dVar6 + dVar7;
      dVar3 = dVar9;
      if (dVar4 <= dVar7) {
        dVar7 = dVar4;
      }
    }
    __return_storage_ptr__->max = dVar3;
    auVar8._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar8._0_8_ = lVar5;
    auVar8._12_4_ = 0x45300000;
    __return_storage_ptr__->min = dVar4;
    __return_storage_ptr__->mean =
         dVar6 / ((auVar8._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0));
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->mean = dVar6;
  __return_storage_ptr__->min = dVar6;
  return __return_storage_ptr__;
}

Assistant:

VectorData find_max_min_mean(const std::vector<Number>& numbers)
{
	VectorData vd;

	auto it = numbers.begin();
	vd.max = *it;
	vd.min = *it;
	double sum = *it;

	if (numbers.size() == 1)
	{
		vd.min = vd.mean = vd.max;
		return vd;
	}

	for (it = it + 1; it != numbers.end(); ++it)
	{
		if (vd.max < *it)
			vd.max = *it;
		if (vd.min > * it)
			vd.min = *it;
		sum += *it;
	}

	vd.mean = sum / numbers.size();
	return vd;
}